

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::ComputeAofs
          (NavierStokesBase *this,int comp,int ncomp,MultiFab *S,int S_comp,MultiFab *forcing_term,
          MultiFab *divu,bool is_velocity,Real dt)

{
  AdvectionForm AVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  AdvectionForm *pAVar6;
  uint *puVar7;
  iterator piVar8;
  BoxArray *pBVar9;
  long lVar10;
  int in_EDX;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  byte in_stack_00000010;
  int d_1;
  int d;
  bool godunov_use_ppm;
  DeviceVector<amrex::BCRec> *bcrec_d;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcrec_h;
  BoxArray *ba;
  int i_1;
  int nghost;
  undefined1 in_stack_00000bef;
  Real in_stack_00000bf0;
  undefined1 in_stack_00000bff;
  MultiFab *in_stack_00000c00;
  int in_stack_00000c0c;
  MultiFab *in_stack_00000c10;
  int in_stack_00000c18;
  int in_stack_00000c1c;
  MultiFab *in_stack_00000c20;
  int i;
  Vector<int,_std::allocator<int>_> iconserv_h;
  DeviceVector<int> iconserv;
  MultiFab *in_stack_00001140;
  MultiFab *in_stack_00001148;
  MultiFab *in_stack_00001150;
  MultiFab *in_stack_00001158;
  MultiFab *in_stack_00001160;
  int in_stack_00001168;
  MultiFab *in_stack_00001178;
  MultiFab *in_stack_00001180;
  MultiFab *in_stack_00001188;
  int in_stack_00001190;
  MultiFab *in_stack_00001198;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_000011a0;
  BCRec *in_stack_000011a8;
  DeviceVector<int> *in_stack_000011b0;
  Geometry *in_stack_000011b8;
  string *in_stack_000011c8;
  undefined1 in_stack_000014a7;
  Real in_stack_000014a8;
  undefined1 in_stack_000014b7;
  MultiFab *in_stack_000014b8;
  int in_stack_000014c4;
  MultiFab *in_stack_000014c8;
  int in_stack_000014d0;
  int in_stack_000014d4;
  MultiFab *in_stack_000014d8;
  MultiFab *in_stack_000017a0;
  MultiFab *in_stack_000017a8;
  MultiFab *in_stack_000017b0;
  MultiFab *in_stack_000017b8;
  MultiFab *in_stack_000017c0;
  int in_stack_000017c8;
  MultiFab *in_stack_000017d8;
  MultiFab *in_stack_000017e0;
  MultiFab *in_stack_000017e8;
  int in_stack_000017f0;
  MultiFab *in_stack_000017f8;
  int in_stack_00001800;
  MultiFab *in_stack_00001808;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_00001810;
  BCRec *in_stack_00001818;
  Geometry *in_stack_00001820;
  Vector<int,_std::allocator<int>_> *in_stack_00001828;
  string *in_stack_00001838;
  FluxRegister *in_stack_fffffffffffff138;
  NavierStokesBase *in_stack_fffffffffffff140;
  int *in_stack_fffffffffffff150;
  size_type in_stack_fffffffffffff158;
  undefined4 in_stack_fffffffffffff160;
  undefined4 in_stack_fffffffffffff164;
  undefined4 in_stack_fffffffffffff168;
  undefined4 in_stack_fffffffffffff16c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff170;
  BCRec *in_stack_fffffffffffff1b0;
  string *in_stack_fffffffffffff1b8;
  string *in_stack_fffffffffffff1c0;
  undefined4 uVar11;
  uint in_stack_fffffffffffff1c8;
  undefined4 in_stack_fffffffffffff1cc;
  FluxRegister *in_stack_fffffffffffff1d0;
  undefined4 uVar12;
  undefined1 *local_de8;
  long *local_dd0;
  BCRec *in_stack_fffffffffffff320;
  undefined8 in_stack_fffffffffffff328;
  int in_stack_fffffffffffff330;
  uint in_stack_fffffffffffff334;
  NavierStokesBase *in_stack_fffffffffffff338;
  FluxRegister *in_stack_fffffffffffff340;
  FrOp in_stack_fffffffffffff350;
  PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *local_b68;
  long local_b60;
  long *local_ae8;
  undefined1 *local_ad0;
  int local_aa8;
  int local_aa4;
  string local_aa0 [39];
  byte local_a79;
  string local_a78 [48];
  undefined8 local_a48 [6];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a18;
  element_type *peStack_a10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a08;
  element_type *peStack_a00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9f8;
  BoxArray *local_9e8;
  int local_9e0;
  undefined4 local_9dc;
  long local_9d8 [80];
  undefined1 in_stack_fffffffffffff8ae;
  undefined1 in_stack_fffffffffffff8af;
  undefined8 in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8bc;
  undefined8 in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8cc;
  undefined8 in_stack_fffffffffffff8d0;
  element_type *in_stack_fffffffffffffa80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffa88;
  MultiFab *in_stack_fffffffffffffa90;
  MultiFab *in_stack_fffffffffffffa98;
  MultiFab *in_stack_fffffffffffffaa0;
  int in_stack_fffffffffffffaa8;
  MultiFab *in_stack_fffffffffffffab8;
  MultiFab *in_stack_fffffffffffffac0;
  MultiFab *in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffad0;
  MultiFab *in_stack_fffffffffffffad8;
  RefID in_stack_fffffffffffffae0;
  RefID in_stack_fffffffffffffae8;
  DeviceVector<int> *in_stack_fffffffffffffaf0;
  Geometry *in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffdc7;
  _Bit_pointer in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdd7;
  undefined5 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddd;
  undefined1 in_stack_fffffffffffffdde;
  undefined1 in_stack_fffffffffffffddf;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  MultiFab *in_stack_fffffffffffffe10;
  MultiArray4<const_double> in_stack_fffffffffffffe40;
  pointer in_stack_fffffffffffffe48;
  pointer in_stack_fffffffffffffe50;
  pointer in_stack_fffffffffffffe58;
  MultiFab *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  MultiFab *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  _Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false> in_stack_fffffffffffffe80;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> in_stack_fffffffffffffe88;
  BATType in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined8 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined1 auStack_d8 [8];
  int *local_d0;
  int *local_c8;
  int local_b8;
  undefined4 local_a8;
  undefined4 local_a4;
  string local_a0 [24];
  PODVector<int,_std::allocator<int>_> local_88;
  undefined8 local_70;
  byte local_61;
  int local_48;
  char *local_38;
  
  local_61 = in_stack_00000010 & 1;
  local_70 = in_XMM0_Qa;
  local_48 = in_EDX;
  amrex::PODVector<int,_std::allocator<int>_>::PODVector
            ((PODVector<int,_std::allocator<int>_> *)in_stack_fffffffffffff140);
  amrex::Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x7cddaa);
  local_a4 = 0;
  amrex::PODVector<int,_std::allocator<int>_>::resize
            ((PODVector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),in_stack_fffffffffffff158
             ,in_stack_fffffffffffff150);
  local_a8 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffff170,CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168)
             ,(value_type *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160));
  for (local_b8 = 0; local_b8 < local_48; local_b8 = local_b8 + 1) {
    pAVar6 = amrex::Vector<AdvectionForm,_std::allocator<AdvectionForm>_>::operator[]
                       ((Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *)
                        in_stack_fffffffffffff140,(size_type)in_stack_fffffffffffff138);
    AVar1 = *pAVar6;
    puVar7 = (uint *)amrex::Vector<int,_std::allocator<int>_>::operator[]
                               ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff140,
                                (size_type)in_stack_fffffffffffff138);
    *puVar7 = (uint)(AVar1 == Conservative);
  }
  local_c8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff138);
  local_d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff138);
  piVar8 = amrex::PODVector<int,_std::allocator<int>_>::begin(&local_88);
  amrex::Gpu::copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*>
            (local_c8,local_d0,piVar8);
  local_ad0 = &stack0xfffffffffffffaa8;
  do {
    amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffff140);
    local_ad0 = local_ad0 + 0x180;
  } while (local_ad0 != auStack_d8);
  local_ae8 = local_9d8;
  do {
    amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffff140);
    local_ae8 = local_ae8 + 0x30;
  } while (local_ae8 != (long *)&stack0xfffffffffffffaa8);
  local_9dc = 0;
  for (local_9e0 = 0; local_9e0 < 3; local_9e0 = local_9e0 + 1) {
    pBVar9 = amrex::AmrLevel::getEdgeBoxArray
                       (&in_stack_fffffffffffff140->super_AmrLevel,
                        (int)((ulong)in_stack_fffffffffffff138 >> 0x20));
    iVar2 = local_48;
    uVar11 = local_9dc;
    lVar10 = (long)local_9e0;
    local_a08._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_a00 = (element_type *)0x0;
    local_a18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_a10 = (element_type *)0x0;
    local_9f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_9e8 = pBVar9;
    amrex::MFInfo::MFInfo((MFInfo *)0x7ce078);
    amrex::AmrLevel::Factory(&in_stack_fffffffffffff140->super_AmrLevel);
    (**(code **)(*(long *)(&stack0xfffffffffffffaa8 + lVar10 * 0x180) + 0x10))
              (&stack0xfffffffffffffaa8 + lVar10 * 0x180,pBVar9,in_RDI + 0x140,iVar2,uVar11,
               &local_a18);
    amrex::MFInfo::~MFInfo((MFInfo *)0x7ce0e2);
    iVar2 = local_48;
    uVar11 = local_9dc;
    pBVar9 = local_9e8;
    lVar10 = (long)local_9e0;
    local_a48[2] = 0;
    local_a48[3] = 0;
    local_a48[0] = 0;
    local_a48[1] = 0;
    local_a48[4] = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x7ce180);
    in_stack_fffffffffffff138 =
         (FluxRegister *)amrex::AmrLevel::Factory(&in_stack_fffffffffffff140->super_AmrLevel);
    (**(code **)(local_9d8[lVar10 * 0x30] + 0x10))
              (local_9d8 + lVar10 * 0x30,pBVar9,in_RDI + 0x140,iVar2,uVar11,local_a48);
    amrex::MFInfo::~MFInfo((MFInfo *)0x7ce1ea);
  }
  if ((local_61 & 1) == 0) {
    local_b60 = in_RDI + 0xbb0;
  }
  else {
    local_b60 = in_RDI + 0xb98;
  }
  local_a78[0x28] = (string)(undefined1)local_b60;
  local_a78[0x29] = (string)local_b60._1_1_;
  local_a78[0x2a] = (string)local_b60._2_1_;
  local_a78[0x2b] = (string)local_b60._3_1_;
  local_a78[0x2c] = (string)local_b60._4_1_;
  local_a78[0x2d] = (string)local_b60._5_1_;
  local_a78[0x2e] = (string)local_b60._6_1_;
  local_a78[0x2f] = (string)local_b60._7_1_;
  if ((local_61 & 1) == 0) {
    local_b68 = (PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(in_RDI + 0xbe0);
  }
  else {
    local_b68 = (PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(in_RDI + 0xbc8);
  }
  local_a78._32_8_ = local_b68;
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff140,(char *)in_stack_fffffffffffff138);
  if ((bVar4) && ((local_61 & 1) == 0)) {
    in_stack_fffffffffffff138 = (FluxRegister *)(*(long *)(in_RDI + 0xb80) + 0x180);
    in_stack_fffffffffffff140 = (NavierStokesBase *)(*(long *)(in_RDI + 0xb80) + 0x300);
    amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
              ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_a78._32_8_);
    in_stack_fffffffffffff1b0 = (BCRec *)(in_RDI + 0x10);
    in_stack_fffffffffffff1c0 =
         (string *)
         (CONCAT44((int)((ulong)in_stack_fffffffffffff1c0 >> 0x20),(uint)local_61) &
         0xffffffff00000001);
    in_stack_fffffffffffff1b8 = local_a0;
    BDS::ComputeAofs((MultiFab *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,
                     (MultiFab *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                     in_stack_fffffffffffffde4,
                     (MultiFab *)
                     CONCAT17(in_stack_fffffffffffffddf,
                              CONCAT16(in_stack_fffffffffffffdde,
                                       CONCAT15(in_stack_fffffffffffffddd,in_stack_fffffffffffffdd8)
                                      )),(MultiFab *)in_stack_fffffffffffffe40.hp,
                     (MultiFab *)in_stack_fffffffffffffe48,(MultiFab *)in_stack_fffffffffffffe50,
                     (MultiFab *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe68,(bool)in_stack_fffffffffffffdd7,
                     (MultiFab *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                     (MultiFab *)in_stack_fffffffffffffe80._M_head_impl,
                     (MultiFab *)in_stack_fffffffffffffe88._M_head_impl,in_stack_fffffffffffffe90,
                     (MultiFab *)in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,
                     (MultiFab *)in_stack_fffffffffffffea8,
                     (BCRec *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (Geometry *)in_stack_fffffffffffffeb8,
                     (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
                     (Real)in_stack_fffffffffffffdc8,(bool)in_stack_fffffffffffffdc7);
  }
  else {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff140,(char *)in_stack_fffffffffffff138);
    if (((bVar4) ||
        (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff140,(char *)in_stack_fffffffffffff138),
        bVar4)) ||
       ((bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff140,(char *)in_stack_fffffffffffff138),
        bVar4 && ((local_61 & 1) != 0)))) {
      uVar11 = (undefined4)((ulong)in_stack_fffffffffffff1c0 >> 0x20);
      uVar12 = (undefined4)((ulong)in_stack_fffffffffffff1d0 >> 0x20);
      EBFactory((NavierStokesBase *)0x7ce58d);
      bVar4 = amrex::EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x7ce595);
      if (bVar4) {
        local_a79 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff140,(char *)in_stack_fffffffffffff138);
        in_stack_fffffffffffff138 = (FluxRegister *)(*(long *)(in_RDI + 0xb80) + 0x180);
        in_stack_fffffffffffff140 = (NavierStokesBase *)(*(long *)(in_RDI + 0xb80) + 0x300);
        amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
                  ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_a78._32_8_);
        in_stack_fffffffffffff1b0 = (BCRec *)(in_RDI + 0x10);
        in_stack_fffffffffffff1d0 =
             (FluxRegister *)(CONCAT44(uVar12,(uint)local_61) & 0xffffffff00000001);
        in_stack_fffffffffffff1c8 = godunov_use_forces_in_trans & 1;
        in_stack_fffffffffffff1c0 =
             (string *)(CONCAT44(uVar11,(uint)local_a79) & 0xffffffff00000001);
        in_stack_fffffffffffff1b8 = local_a0;
        in_stack_fffffffffffff338 = in_stack_fffffffffffff140;
        in_stack_fffffffffffff340 = in_stack_fffffffffffff138;
        Godunov::ComputeAofs
                  (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,
                   (MultiFab *)in_stack_fffffffffffffe00._M_head_impl,in_stack_fffffffffffffdfc,
                   (MultiFab *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   (MultiFab *)in_stack_fffffffffffffe50,(MultiFab *)in_stack_fffffffffffffe58,
                   in_stack_fffffffffffffe60,
                   (MultiFab *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                   in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                   (bool)in_stack_fffffffffffffdef,
                   (MultiFab *)in_stack_fffffffffffffe88._M_head_impl,
                   (MultiFab *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (MultiFab *)in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,
                   (MultiFab *)in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
                   (MultiFab *)in_stack_fffffffffffffeb8,(BCRec *)in_stack_fffffffffffffec0,
                   (Geometry *)in_stack_fffffffffffffec8,
                   (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
                   (Real)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   (bool)in_stack_fffffffffffffddf,(bool)in_stack_fffffffffffffdde,
                   (bool)in_stack_fffffffffffffddd);
      }
      else {
        in_stack_fffffffffffff138 = (FluxRegister *)(*(long *)(in_RDI + 0xb80) + 0x180);
        in_stack_fffffffffffff140 = (NavierStokesBase *)(*(long *)(in_RDI + 0xb80) + 0x300);
        in_stack_fffffffffffff1b0 =
             amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
                       ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_a78._32_8_);
        bVar3 = local_61;
        in_stack_fffffffffffff1b8 = (string *)(in_RDI + 0x10);
        std::__cxx11::string::string(local_a78,(string *)&redistribution_type_abi_cxx11_);
        in_stack_fffffffffffff1d0 = (FluxRegister *)local_a78;
        in_stack_fffffffffffff1c8 = bVar3 & 1;
        in_stack_fffffffffffff1c0 = local_a0;
        EBGodunov::ComputeAofs
                  (in_stack_000014d8,in_stack_000014d4,in_stack_000014d0,in_stack_000014c8,
                   in_stack_000014c4,in_stack_000014b8,in_stack_000017a0,in_stack_000017a8,
                   in_stack_000017b0,in_stack_000017b8,in_stack_000017c0,in_stack_000017c8,
                   (bool)in_stack_000014b7,in_stack_000017d8,in_stack_000017e0,in_stack_000017e8,
                   in_stack_000017f0,in_stack_000017f8,in_stack_00001800,in_stack_00001808,
                   in_stack_00001810,in_stack_00001818,in_stack_00001820,in_stack_00001828,
                   in_stack_000014a8,(bool)in_stack_000014a7,in_stack_00001838);
        std::__cxx11::string::~string(local_a78);
      }
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff140,(char *)in_stack_fffffffffffff138);
      in_stack_fffffffffffff334 = CONCAT13(bVar4,(int3)in_stack_fffffffffffff334);
      if (bVar4) {
        EBFactory((NavierStokesBase *)0x7ceae4);
        uVar11 = (undefined4)((ulong)in_stack_fffffffffffff1b8 >> 0x20);
        bVar4 = amrex::EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x7ceaec);
        if (bVar4) {
          in_stack_fffffffffffff138 = (FluxRegister *)(*(long *)(in_RDI + 0xb80) + 0x180);
          in_stack_fffffffffffff140 = (NavierStokesBase *)(*(long *)(in_RDI + 0xb80) + 0x300);
          amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
                    ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_a78._32_8_);
          in_stack_fffffffffffff1b0 = (BCRec *)(in_RDI + 0x10);
          in_stack_fffffffffffff1b8 =
               (string *)(CONCAT44(uVar11,(uint)local_61) & 0xffffffff00000001);
          MOL::ComputeAofs((MultiFab *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc,
                           in_stack_fffffffffffff8c8,(MultiFab *)in_stack_fffffffffffff8c0,
                           in_stack_fffffffffffff8bc,(MultiFab *)in_stack_fffffffffffff8b0,
                           (MultiFab *)in_stack_fffffffffffffa80,
                           (MultiFab *)in_stack_fffffffffffffa88._M_pi,in_stack_fffffffffffffa90,
                           in_stack_fffffffffffffa98,in_stack_fffffffffffffaa0,
                           in_stack_fffffffffffffaa8,(bool)in_stack_fffffffffffff8af,
                           in_stack_fffffffffffffab8,in_stack_fffffffffffffac0,
                           in_stack_fffffffffffffac8,in_stack_fffffffffffffad0,
                           in_stack_fffffffffffffad8,
                           (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                           in_stack_fffffffffffffae0.data,(BCRec *)in_stack_fffffffffffffae8.data,
                           in_stack_fffffffffffffaf0,in_stack_fffffffffffffaf8,
                           (bool)in_stack_fffffffffffff8ae);
        }
        else {
          in_stack_fffffffffffff138 = (FluxRegister *)(*(long *)(in_RDI + 0xb80) + 0x180);
          in_stack_fffffffffffff140 = (NavierStokesBase *)(*(long *)(in_RDI + 0xb80) + 0x300);
          amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
                    ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_a78._32_8_);
          in_stack_fffffffffffff1b0 = (BCRec *)(in_RDI + 0x10);
          in_stack_fffffffffffff334 =
               CONCAT13((char)(in_stack_fffffffffffff334 >> 0x18),
                        CONCAT12(local_61,(short)in_stack_fffffffffffff334));
          std::__cxx11::string::string(local_aa0,(string *)&redistribution_type_abi_cxx11_);
          in_stack_fffffffffffff1c0 = local_aa0;
          in_stack_fffffffffffff1b8 =
               (string *)(CONCAT44(uVar11,in_stack_fffffffffffff334 >> 0x10) & 0xffffffff00000001);
          in_stack_fffffffffffff320 = in_stack_fffffffffffff1b0;
          EBMOL::ComputeAofs(in_stack_00000c20,in_stack_00000c1c,in_stack_00000c18,in_stack_00000c10
                             ,in_stack_00000c0c,in_stack_00000c00,in_stack_00001140,
                             in_stack_00001148,in_stack_00001150,in_stack_00001158,in_stack_00001160
                             ,in_stack_00001168,(bool)in_stack_00000bff,in_stack_00001178,
                             in_stack_00001180,in_stack_00001188,in_stack_00001190,in_stack_00001198
                             ,in_stack_000011a0,in_stack_000011a8,in_stack_000011b0,
                             in_stack_000011b8,in_stack_00000bf0,(bool)in_stack_00000bef,
                             in_stack_000011c8);
          std::__cxx11::string::~string(local_aa0);
          in_stack_fffffffffffff328 = local_70;
        }
      }
      else {
        local_38 = "NSB::ComputeAofs: Unknown advection_scheme";
        amrex::Abort_host((char *)in_stack_fffffffffffff150);
      }
    }
  }
  if (do_reflux != 0) {
    if (0 < *(int *)(in_RDI + 8)) {
      for (local_aa4 = 0; local_aa4 < 3; local_aa4 = local_aa4 + 1) {
        amrex::FluxRegister::FineAdd
                  (in_stack_fffffffffffff1d0,
                   (MultiFab *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8),
                   (int)((ulong)in_stack_fffffffffffff1c0 >> 0x20),(int)in_stack_fffffffffffff1c0,
                   (int)((ulong)in_stack_fffffffffffff1b8 >> 0x20),(int)in_stack_fffffffffffff1b8,
                   (Real)in_stack_fffffffffffff1b0);
      }
    }
    iVar2 = *(int *)(in_RDI + 8);
    iVar5 = amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150));
    if (iVar2 < iVar5) {
      for (local_aa8 = 0; local_aa8 < 3; local_aa8 = local_aa8 + 1) {
        getAdvFluxReg(in_stack_fffffffffffff140,(int)((ulong)in_stack_fffffffffffff138 >> 0x20));
        in_stack_fffffffffffff138 =
             (FluxRegister *)((ulong)in_stack_fffffffffffff138 & 0xffffffff00000000);
        amrex::FluxRegister::CrseInit
                  (in_stack_fffffffffffff340,(MultiFab *)in_stack_fffffffffffff338,
                   in_stack_fffffffffffff334,in_stack_fffffffffffff330,
                   (int)((ulong)in_stack_fffffffffffff328 >> 0x20),(int)in_stack_fffffffffffff328,
                   (Real)in_stack_fffffffffffff320,in_stack_fffffffffffff350);
      }
    }
  }
  local_dd0 = (long *)&stack0xfffffffffffffaa8;
  do {
    local_dd0 = local_dd0 + -0x30;
    amrex::MultiFab::~MultiFab((MultiFab *)0x7cf124);
  } while (local_dd0 != local_9d8);
  local_de8 = auStack_d8;
  do {
    local_de8 = local_de8 + -0x180;
    amrex::MultiFab::~MultiFab((MultiFab *)0x7cf17b);
  } while (local_de8 != &stack0xfffffffffffffaa8);
  amrex::Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x7cf1a5);
  amrex::PODVector<int,_std::allocator<int>_>::~PODVector
            ((PODVector<int,_std::allocator<int>_> *)in_stack_fffffffffffff140);
  return;
}

Assistant:

void
NavierStokesBase::ComputeAofs ( int comp, int ncomp,
                                MultiFab const& S,
                                int S_comp,
                                MultiFab const& forcing_term,
                                MultiFab const& divu,
                                bool is_velocity, Real dt )
{

    // Advection type conservative or non?
    amrex::Gpu::DeviceVector<int> iconserv;
    Vector<int> iconserv_h;
    iconserv.resize(ncomp, 0);
    iconserv_h.resize(ncomp, 0);
    for (int i = 0; i < ncomp; ++i) {
        iconserv_h[i] = (advectionType[comp+i] == Conservative) ? 1 : 0;
    }
    Gpu::copy(Gpu::hostToDevice,iconserv_h.begin(),iconserv_h.end(), iconserv.begin());

    MultiFab cfluxes[AMREX_SPACEDIM];
    MultiFab edgestate[AMREX_SPACEDIM];

    //
    // Advection needs S to have 2-3 ghost cells.
    // Advection routines call slopes on cells i & i+1, and then
    // 2nd order slopes use i+/-1 => S needs 2 ghost cells (MOL)
    // 4th order slopes use i+/-2 => S needs 3 ghost cells (Godunov)
    //
    int nghost = 0;
    for (int i = 0; i < AMREX_SPACEDIM; ++i)
    {
        const BoxArray& ba = getEdgeBoxArray(i);
        cfluxes[i].define(ba, dmap, ncomp, nghost, MFInfo(), Factory());
        edgestate[i].define(ba, dmap, ncomp, nghost, MFInfo(), Factory());
    }

    auto const& bcrec_h = is_velocity? m_bcrec_velocity   : m_bcrec_scalars;
    auto const& bcrec_d = is_velocity? m_bcrec_velocity_d : m_bcrec_scalars_d;

    //
    // >>>>>>>>>>>>>>>>>>>>>>>>>>>  BDS ALGORITHM <<<<<<<<<<<<<<<<<<<<<<<<<<<<<<
    //
    if (advection_scheme == "BDS" && (!is_velocity))
    {
        BDS::ComputeAofs(*aofs, comp, ncomp,
                         S, S_comp,
                         AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                         AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]),
                         0, false,
                         AMREX_D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]),
                         0, forcing_term, 0, divu, bcrec_d.dataPtr(),
                         geom, iconserv_h, dt, is_velocity);
    }
    else if (advection_scheme == "Godunov_PLM" || advection_scheme == "Godunov_PPM" || (advection_scheme == "BDS" && is_velocity) )
    {
        //
        // >>>>>>>>>>>>>>>>>>>>>>>>>>>  Godunov ALGORITHM <<<<<<<<<<<<<<<<<<<<<<<<<<<<<<
        //
#ifdef AMREX_USE_EB
        if (!EBFactory().isAllRegular())
        {
            EBGodunov::ComputeAofs(*aofs, comp, ncomp,
                                    S, S_comp,
                                    AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                    AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]),
                                    0, false,
                                    AMREX_D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]), 0,
                                    forcing_term, 0, divu,
                                    bcrec_h, bcrec_d.dataPtr(),
                                    geom, iconserv_h, dt, is_velocity, redistribution_type);
        }
        else
#endif
        {
            bool godunov_use_ppm = ( advection_scheme == "Godunov_PPM" ? true : false );

            Godunov::ComputeAofs(*aofs, comp, ncomp,
                                 S, S_comp,
                                 AMREX_D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                                 AMREX_D_DECL(edgestate[0],edgestate[1],edgestate[2]),
                                 0, false,
                                 AMREX_D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]),
                                 0, forcing_term, 0, divu, bcrec_d.dataPtr(),
                                 geom, iconserv_h, dt,
                                 godunov_use_ppm, godunov_use_forces_in_trans, is_velocity);
        }
    }
    else if ( advection_scheme == "MOL" )
    {
        
        //
        // >>>>>>>>>>>>>>>>>>>>>>>>>>>  MOL ALGORITHM <<<<<<<<<<<<<<<<<<<<<<<<<<<<<<
        //
#ifdef AMREX_USE_EB
        if (!EBFactory().isAllRegular())
        {
            EBMOL::ComputeAofs(*aofs, comp, ncomp,
                               S, S_comp,
                               D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                               D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                               D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]), 0,
                               divu,
                               bcrec_h, bcrec_d.dataPtr(), iconserv,
                               geom, dt, is_velocity, redistribution_type );
        }
        else
#endif
        {
            MOL::ComputeAofs(*aofs, comp, ncomp,
                             S, S_comp,
                             D_DECL(u_mac[0],u_mac[1],u_mac[2]),
                             D_DECL(edgestate[0],edgestate[1],edgestate[2]), 0, false,
                             D_DECL(cfluxes[0],cfluxes[1],cfluxes[2]), 0,
                             divu,
                             bcrec_h, bcrec_d.dataPtr(), iconserv,
                             geom, is_velocity );
        }
    }
    else
    {
        Abort("NSB::ComputeAofs: Unknown advection_scheme");
    }

    if (do_reflux)
    {
        if (level > 0 )
        {
            for (int d = 0; d < AMREX_SPACEDIM; d++) {
                advflux_reg->FineAdd(cfluxes[d],d,0,comp,ncomp,dt);
            }
        }

        if (level < parent->finestLevel())
        {
            for (int d = 0; d < AMREX_SPACEDIM; d++) {
                getAdvFluxReg(level+1).CrseInit(cfluxes[d],d,0,comp,ncomp,-dt);
            }
        }
    }

}